

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

lws_tokenize_elem lws_tokenize(lws_tokenize *ts)

{
  size_t sVar1;
  byte c;
  ushort uVar2;
  byte *pbVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  lws_tokenize_elem lVar9;
  ulong uVar10;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  char cVar18;
  uint __c;
  long lStack_70;
  char local_64;
  size_t local_60;
  
  uVar2 = ts->flags;
  local_60 = 0;
  uVar16 = uVar2 & 1;
  uVar6 = 0x2d;
  if ((uVar2 & 1) != 0) {
    uVar16 = uVar6;
    uVar6 = 0;
  }
  uVar14 = uVar2 & 0x10;
  uVar7 = 0x2e;
  if ((uVar2 & 0x10) != 0) {
    uVar14 = uVar7;
    uVar7 = 0;
  }
  ts->token = (char *)0x0;
  ts->token_len = 0;
  bVar4 = true;
  lStack_70 = 0;
  bVar5 = false;
  iVar8 = 0;
  uVar13 = (ulong)(byte)(((uVar2 >> 6 & 1) != 0) - 1);
  sVar1 = ts->len;
  while( true ) {
    sVar17 = sVar1;
    uVar12 = uVar13;
    uVar15 = (uint)lStack_70;
    local_64 = (char)uVar2;
    if (sVar17 == 0) break;
    uVar13 = uVar12 & 0xffffffff;
    pbVar3 = (byte *)ts->start;
    ts->start = (char *)(pbVar3 + 1);
    c = *pbVar3;
    sVar1 = sVar17 - 1;
    ts->len = sVar1;
    iVar8 = lws_check_byte_utf8((uchar)iVar8,c);
    if (iVar8 < 0) {
      return LWS_TOKZE_ERR_BROKEN_UTF8;
    }
    if (c == 0) break;
    if (((bVar4) || (c == 0xd)) || (bVar4 = false, c == 10)) {
      bVar4 = false;
      if ((uVar15 == 1 || -1 < local_64) || c != 0x23) {
        cVar18 = (char)uVar13;
        if (c < 0x3e) {
          uVar10 = (ulong)c;
          if ((0x100003600U >> (uVar10 & 0x3f) & 1) != 0) {
            lVar9 = (*(code *)(&DAT_00137f10 + *(int *)(&DAT_00137f10 + lStack_70 * 4)))
                              (ts,c == 0x23,&DAT_00137f10 + *(int *)(&DAT_00137f10 + lStack_70 * 4),
                               uVar13);
            return lVar9;
          }
          if (uVar10 != 0x22) {
            if (uVar10 != 0x3d) goto LAB_0010eaa6;
            if ((uVar15 & 0xfffffffe) == 2) {
              if (cVar18 == '\x01') {
                return LWS_TOKZE_ERR_NUM_ON_LHS;
              }
              return LWS_TOKZE_ERRS;
            }
            goto LAB_0010eb17;
          }
          if (uVar15 == 1) {
            return LWS_TOKZE_QUOTED_STRING;
          }
          if ((uVar2 & 4) != 0) {
            if (ts->delim == '\x01') {
              return LWS_TOKZE_ERR_COMMA_LIST;
            }
            ts->delim = '\x01';
          }
          ts->token = (char *)(pbVar3 + 1);
          ts->token_len = 0;
          local_60 = 0;
LAB_0010ece0:
          lStack_70 = 1;
          bVar4 = true;
        }
        else {
LAB_0010eaa6:
          if (((c == 0x3a && (uVar15 & 0xfffffffe) == 2) & (byte)((uVar2 & 2) >> 1)) != 0) {
            return LWS_TOKZE_TOKEN_NAME_COLON;
          }
          if (((c == 0x2e) && ((uVar2 & 0x20) == 0)) && ((uVar15 == 2 && (cVar18 == '\x01')))) {
            if (bVar5) {
              return LWS_TOKZE_ERR_MALFORMED_FLOAT;
            }
            local_60 = local_60 + 1;
            ts->token_len = local_60;
            bVar5 = true;
            lStack_70 = 2;
            bVar4 = true;
            uVar13 = CONCAT71((int7)(local_60 >> 8),1);
          }
          else {
LAB_0010eb17:
            if (iVar8 != 0) goto LAB_0010eb1c;
            __c = (uint)(char)c;
            if ((((uVar2 & 8) != 0) &&
                (pvVar11 = memchr("(),/:;<=>?@[\\]{}",__c,0x11), ' ' < (char)c)) &&
               (pvVar11 != (void *)0x0)) {
LAB_0010ecb3:
              if (((byte)(uVar2 >> 8) & c == 0x2f) != 0) goto LAB_0010eb1c;
              if (uVar15 == 1) {
                local_60 = local_60 + 1;
                ts->token_len = local_60;
                goto LAB_0010ece0;
              }
              if (1 < uVar15 - 2) {
                if ((uVar2 & 4) != 0) {
                  if (c != 0x2c) {
                    return LWS_TOKZE_ERR_COMMA_LIST;
                  }
                  if (ts->delim != '\x01') {
                    return LWS_TOKZE_ERR_COMMA_LIST;
                  }
                  ts->delim = '\x02';
                }
                ts->token = (char *)pbVar3;
                ts->token_len = 1;
                return LWS_TOKZE_DELIMITER;
              }
LAB_0010ed55:
              ts->start = (char *)pbVar3;
              ts->len = sVar17;
              goto LAB_0010ed66;
            }
            if ((((uVar2 & 8) == 0) && ((byte)(c - 0x3a) < 0xf6)) && ((byte)(c + 0xa5) < 0xe6)) {
              if (((((uVar16 != __c && c != 0x5f) && (byte)(c + 0x85) < 0xe6) && uVar14 != __c) ||
                  (uVar6 == __c)) || (uVar7 == __c)) goto LAB_0010ecb3;
            }
            else if (uVar7 == __c || uVar6 == __c) goto LAB_0010ecb3;
LAB_0010eb1c:
            if (uVar15 - 1 < 2) {
              local_60 = local_60 + 1;
            }
            else {
              if (uVar15 != 0) goto LAB_0010ed55;
              if ((uVar2 & 4) != 0) {
                if (ts->delim == '\x01') {
                  return LWS_TOKZE_ERR_COMMA_LIST;
                }
                ts->delim = '\x01';
              }
              ts->token = (char *)pbVar3;
              local_60 = 1;
              lStack_70 = 2;
            }
            ts->token_len = local_60;
            bVar4 = true;
            if ((uVar2 & 0x40) == 0) {
              bVar4 = true;
              uVar13 = 0;
              if (0xf5 < (byte)(c - 0x3a)) {
                uVar13 = uVar12 & 0xff;
                if (cVar18 < '\0') {
                  uVar13 = 1;
                }
                bVar4 = true;
              }
            }
          }
        }
      }
    }
  }
  cVar18 = (char)uVar12;
  lVar9 = LWS_TOKZE_ERR_BROKEN_UTF8;
  if (iVar8 == 0) {
    if (uVar15 == 1) {
      lVar9 = LWS_TOKZE_ERR_UNTERM_STRING;
    }
    else if (uVar15 == 0) {
      if (((uVar2 & 4) == 0) || (lVar9 = LWS_TOKZE_ERR_COMMA_LIST, ts->delim != '\x02')) {
        lVar9 = LWS_TOKZE_ENDED;
      }
    }
    else {
LAB_0010ed66:
      if (cVar18 == '\x01') {
        lVar9 = LWS_TOKZE_FLOAT - (uint)!bVar5;
      }
      else {
        lVar9 = LWS_TOKZE_TOKEN;
      }
    }
  }
  return lVar9;
}

Assistant:

lws_tokenize_elem
lws_tokenize(struct lws_tokenize *ts)
{
	const char *rfc7230_delims = "(),/:;<=>?@[\\]{}";
	lws_tokenize_state state = LWS_TOKZS_LEADING_WHITESPACE;
	char c, flo = 0, d_minus = '-', d_dot = '.', s_minus = '\0',
	     s_dot = '\0', skipping = 0;
	signed char num = (ts->flags & LWS_TOKENIZE_F_NO_INTEGERS) ? 0 : -1;
	int utf8 = 0;

	/* for speed, compute the effect of the flags outside the loop */

	if (ts->flags & LWS_TOKENIZE_F_MINUS_NONTERM) {
		d_minus = '\0';
		s_minus = '-';
	}
	if (ts->flags & LWS_TOKENIZE_F_DOT_NONTERM) {
		d_dot = '\0';
		s_dot = '.';
	}

	ts->token = NULL;
	ts->token_len = 0;

	while (ts->len) {
		c = *ts->start++;
		ts->len--;

		utf8 = lws_check_byte_utf8((unsigned char)utf8, c);
		if (utf8 < 0)
			return LWS_TOKZE_ERR_BROKEN_UTF8;

		if (!c)
			break;

		if (skipping) {
			if (c != '\r' && c != '\n')
				continue;
			else
				skipping = 0;
		}

		/* comment */

		if (ts->flags & LWS_TOKENIZE_F_HASH_COMMENT &&
		    state != LWS_TOKZS_QUOTED_STRING &&
		    c == '#') {
			skipping = 1;
			continue;
		}

		/* whitespace */

		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' ||
		    c == '\f') {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
			case LWS_TOKZS_TOKEN_POST_TERMINAL:
				continue;
			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;
			case LWS_TOKZS_TOKEN:
				/* we want to scan forward to look for = */

				state = LWS_TOKZS_TOKEN_POST_TERMINAL;
				continue;
			}
		}

		/* quoted string */

		if (c == '\"') {
			if (state == LWS_TOKZS_QUOTED_STRING)
				return LWS_TOKZE_QUOTED_STRING;

			/* starting a quoted string */

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_QUOTED_STRING;
			ts->token = ts->start;
			ts->token_len = 0;

			continue;
		}

		/* token= aggregation */

		if (c == '=' && (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
				 state == LWS_TOKZS_TOKEN)) {
			if (num == 1)
				return LWS_TOKZE_ERR_NUM_ON_LHS;
			/* swallow the = */
			return LWS_TOKZE_TOKEN_NAME_EQUALS;
		}

		/* optional token: aggregation */

		if ((ts->flags & LWS_TOKENIZE_F_AGG_COLON) && c == ':' &&
		    (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
		     state == LWS_TOKZS_TOKEN))
			/* swallow the : */
			return LWS_TOKZE_TOKEN_NAME_COLON;

		/* aggregate . in a number as a float */

		if (c == '.' && !(ts->flags & LWS_TOKENIZE_F_NO_FLOATS) &&
		    state == LWS_TOKZS_TOKEN && num == 1) {
			if (flo)
				return LWS_TOKZE_ERR_MALFORMED_FLOAT;
			flo = 1;
			ts->token_len++;
			continue;
		}

		/*
		 * Delimiter... by default anything that:
		 *
		 *  - isn't matched earlier, or
		 *  - is [A-Z, a-z, 0-9, _], and
		 *  - is not a partial utf8 char
		 *
		 * is a "delimiter", it marks the end of a token and is itself
		 * reported as a single LWS_TOKZE_DELIMITER each time.
		 *
		 * However with LWS_TOKENIZE_F_RFC7230_DELIMS flag, tokens may
		 * contain any noncontrol character that isn't defined in
		 * rfc7230_delims, and only characters listed there are treated
		 * as delimiters.
		 */

		if (!utf8 &&
		     ((ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS &&
		     strchr(rfc7230_delims, c) && c > 32) ||
		    ((!(ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS) &&
		     (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
		     (c < 'a' || c > 'z') && c != '_') &&
		     c != s_minus && c != s_dot) ||
		    c == d_minus || c == d_dot
		    ) &&
		    !((ts->flags & LWS_TOKENIZE_F_SLASH_NONTERM) && c == '/')) {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
				if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
					if (c != ',' ||
					    ts->delim != LWSTZ_DT_NEED_DELIM)
						return LWS_TOKZE_ERR_COMMA_LIST;
					ts->delim = LWSTZ_DT_NEED_NEXT_CONTENT;
				}

				ts->token = ts->start - 1;
				ts->token_len = 1;
				return LWS_TOKZE_DELIMITER;

			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;

			case LWS_TOKZS_TOKEN_POST_TERMINAL:
			case LWS_TOKZS_TOKEN:
				/* report the delimiter next time */
				ts->start--;
				ts->len++;
				goto token_or_numeric;
			}
		}

		/* anything that's not whitespace or delimiter is payload */

		switch (state) {
		case LWS_TOKZS_LEADING_WHITESPACE:

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_TOKEN;
			ts->token = ts->start - 1;
			ts->token_len = 1;
			goto checknum;

		case LWS_TOKZS_QUOTED_STRING:
		case LWS_TOKZS_TOKEN:
			ts->token_len++;
checknum:
			if (!(ts->flags & LWS_TOKENIZE_F_NO_INTEGERS)) {
				if (c < '0' || c > '9')
					num = 0;
				else
					if (num < 0)
						num = 1;
			}
			continue;

		case LWS_TOKZS_TOKEN_POST_TERMINAL:
			/* report the new token next time */
			ts->start--;
			ts->len++;
			goto token_or_numeric;
		}
	}

	/* we ran out of content */

	if (utf8) /* ended partway through a multibyte char */
		return LWS_TOKZE_ERR_BROKEN_UTF8;

	if (state == LWS_TOKZS_QUOTED_STRING)
		return LWS_TOKZE_ERR_UNTERM_STRING;

	if (state != LWS_TOKZS_TOKEN_POST_TERMINAL &&
	    state != LWS_TOKZS_TOKEN) {
		if ((ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) &&
		     ts->delim == LWSTZ_DT_NEED_NEXT_CONTENT)
			return LWS_TOKZE_ERR_COMMA_LIST;

		return LWS_TOKZE_ENDED;
	}

	/* report the pending token */

token_or_numeric:

	if (num != 1)
		return LWS_TOKZE_TOKEN;
	if (flo)
		return LWS_TOKZE_FLOAT;

	return LWS_TOKZE_INTEGER;
}